

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

void __thiscall Cleaner::Remove(Cleaner *this,string *path)

{
  bool bVar1;
  int iVar2;
  int ret;
  string *path_local;
  Cleaner *this_local;
  
  bVar1 = IsAlreadyRemoved(this,path);
  if (!bVar1) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->removed_,path);
    if ((this->config_->dry_run & 1U) == 0) {
      iVar2 = RemoveFile(this,path);
      if (iVar2 == 0) {
        Report(this,path);
      }
      else if (iVar2 == -1) {
        this->status_ = 1;
      }
    }
    else {
      bVar1 = FileExists(this,path);
      if (bVar1) {
        Report(this,path);
      }
    }
  }
  return;
}

Assistant:

void Cleaner::Remove(const string& path) {
  if (!IsAlreadyRemoved(path)) {
    removed_.insert(path);
    if (config_.dry_run) {
      if (FileExists(path))
        Report(path);
    } else {
      int ret = RemoveFile(path);
      if (ret == 0)
        Report(path);
      else if (ret == -1)
        status_ = 1;
    }
  }
}